

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
GlobalBailOutRecordDataTable::Finalize
          (GlobalBailOutRecordDataTable *this,Allocator *allocator,JitArenaAllocator *tempAlloc)

{
  code *pcVar1;
  bool bVar2;
  Memory *this_00;
  undefined4 *puVar3;
  uint local_68;
  uint local_64;
  uint32 i;
  uint32 currStart;
  TrackAllocData local_50;
  GlobalBailOutRecordDataRow *local_28;
  GlobalBailOutRecordDataRow *newRows;
  JitArenaAllocator *tempAlloc_local;
  Allocator *allocator_local;
  GlobalBailOutRecordDataTable *this_local;
  
  newRows = (GlobalBailOutRecordDataRow *)tempAlloc;
  tempAlloc_local = (JitArenaAllocator *)allocator;
  allocator_local = (Allocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&GlobalBailOutRecordDataRow::typeinfo,0,(ulong)this->length,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
             ,0xba9);
  this_00 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(allocator,&local_50);
  local_28 = Memory::
             AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>>,GlobalBailOutRecordDataRow,false>
                       (this_00,(AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>
                                 *)NativeCodeData::
                                   AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>
                                   ::AllocZero,0,(ulong)this->length);
  memcpy(local_28,this->globalBailOutRecordDataRows,(ulong)this->length << 4);
  Memory::DeleteArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow>
            ((AllocatorType *)newRows,(ulong)this->length,this->globalBailOutRecordDataRows);
  this->globalBailOutRecordDataRows = local_28;
  this->size = this->length;
  if (this->length != 0) {
    local_64 = this->globalBailOutRecordDataRows->start;
    for (local_68 = 1; local_68 < this->length; local_68 = local_68 + 1) {
      if (this->globalBailOutRecordDataRows[local_68].start < local_64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0xbb6,"(currStart <= globalBailOutRecordDataRows[i].start)",
                           "Rows in the table must be in order by start ID");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      local_64 = this->globalBailOutRecordDataRows[local_68].start;
    }
  }
  return;
}

Assistant:

void GlobalBailOutRecordDataTable::Finalize(NativeCodeData::Allocator *allocator, JitArenaAllocator *tempAlloc)
{
    GlobalBailOutRecordDataRow *newRows = NativeCodeDataNewArrayZNoFixup(allocator, GlobalBailOutRecordDataRow, length);
    memcpy(newRows, globalBailOutRecordDataRows, sizeof(GlobalBailOutRecordDataRow) * length);
    JitAdeleteArray(tempAlloc, length, globalBailOutRecordDataRows);
    globalBailOutRecordDataRows = newRows;
    size = length;

#if DBG
    if (length > 0)
    {
        uint32 currStart = globalBailOutRecordDataRows[0].start;
        for (uint32 i = 1; i < length; i++)
        {
            AssertMsg(currStart <= globalBailOutRecordDataRows[i].start,
                      "Rows in the table must be in order by start ID");
            currStart = globalBailOutRecordDataRows[i].start;
        }
    }
#endif
}